

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::replaceInPlace(string *str,string *replaceThis,string *withThis)

{
  undefined8 *puVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar2 = std::__cxx11::string::find((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,0);
  if (uVar2 != 0xffffffffffffffff) {
    uVar5 = uVar2;
    do {
      std::__cxx11::string::substr((ulong)local_50,(ulong)str);
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(withThis->_M_dataplus)._M_p);
      puVar6 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar6) {
        local_a0 = *puVar6;
        lStack_98 = plVar3[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *puVar6;
        local_b0 = (ulong *)*plVar3;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)puVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
      uVar7 = 0xf;
      if (local_b0 != &local_a0) {
        uVar7 = local_a0;
      }
      if (uVar7 < (ulong)(local_68 + local_a8)) {
        uVar7 = 0xf;
        if (local_70 != local_60) {
          uVar7 = local_60[0];
        }
        if (uVar7 < (ulong)(local_68 + local_a8)) goto LAB_0013640e;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
      }
      else {
LAB_0013640e:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70);
      }
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_80 = *puVar1;
        uStack_78 = puVar4[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar1;
        local_90 = (undefined8 *)*puVar4;
      }
      local_88 = puVar4[1];
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=((string *)str,(string *)&local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (str->_M_string_length - withThis->_M_string_length <= uVar5) break;
      uVar5 = std::__cxx11::string::find
                        ((char *)str,(ulong)(replaceThis->_M_dataplus)._M_p,
                         withThis->_M_string_length + uVar5);
    } while (uVar5 != 0xffffffffffffffff);
  }
  return uVar2 != 0xffffffffffffffff;
}

Assistant:

bool replaceInPlace( std::string& str, std::string const& replaceThis, std::string const& withThis ) {
        bool replaced = false;
        std::size_t i = str.find( replaceThis );
        while( i != std::string::npos ) {
            replaced = true;
            str = str.substr( 0, i ) + withThis + str.substr( i+replaceThis.size() );
            if( i < str.size()-withThis.size() )
                i = str.find( replaceThis, i+withThis.size() );
            else
                i = std::string::npos;
        }
        return replaced;
    }